

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O2

void Imf_2_5::anon_unknown_9::dctInverse8x8_scalar<5>(float *data)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 0x20) {
    fVar7 = *(float *)((long)data + lVar2 + 0x10);
    fVar4 = (*(float *)((long)data + lVar2) + fVar7) * 0.35355362;
    fVar5 = (*(float *)((long)data + lVar2) - fVar7) * 0.35355362;
    fVar7 = *(float *)((long)data + lVar2 + 8);
    fVar8 = *(float *)((long)data + lVar2 + 0x18);
    fVar9 = fVar7 * 0.19134216 - fVar8 * 0.46193984;
    fVar6 = fVar8 * 0.19134216 + fVar7 * 0.46193984;
    fVar7 = *(float *)((long)data + lVar2 + 0xc);
    fVar8 = *(float *)((long)data + lVar2 + 4);
    fVar13 = *(float *)((long)data + lVar2 + 0x14);
    fVar3 = *(float *)((long)data + lVar2 + 0x1c);
    fVar10 = fVar3 * 0.097545706 + fVar13 * 0.27778545 + fVar8 * 0.49039266 + fVar7 * 0.41573495;
    fVar11 = fVar3 * -0.27778545 + fVar13 * -0.49039266 + fVar8 * 0.41573495 + fVar7 * -0.097545706;
    fVar12 = fVar3 * 0.41573495 + fVar13 * 0.097545706 + fVar8 * 0.27778545 + fVar7 * -0.49039266;
    fVar13 = fVar3 * -0.49039266 + fVar13 * 0.41573495 + fVar8 * 0.097545706 + fVar7 * -0.27778545;
    fVar7 = fVar9 + fVar5;
    fVar8 = fVar6 + fVar4;
    fVar4 = fVar4 - fVar6;
    fVar5 = fVar5 - fVar9;
    pfVar1 = (float *)((long)data + lVar2);
    *pfVar1 = fVar10 + fVar8;
    pfVar1[1] = fVar11 + fVar7;
    pfVar1[2] = fVar12 + fVar5;
    pfVar1[3] = fVar13 + fVar4;
    pfVar1 = (float *)((long)data + lVar2 + 0x10);
    *pfVar1 = fVar4 - fVar13;
    pfVar1[1] = fVar5 - fVar12;
    pfVar1[2] = fVar7 - fVar11;
    pfVar1[3] = fVar8 - fVar10;
  }
  for (lVar2 = -0x20; lVar2 != 0; lVar2 = lVar2 + 4) {
    fVar7 = *(float *)((long)data + lVar2 + 0x60);
    fVar8 = *(float *)((long)data + lVar2 + 0xe0);
    fVar6 = fVar7 * 0.19134216 - fVar8 * 0.46193984;
    fVar9 = fVar8 * 0.19134216 + fVar7 * 0.46193984;
    fVar7 = *(float *)((long)data + lVar2 + 0x40);
    fVar8 = *(float *)((long)data + lVar2 + 0x80);
    fVar13 = *(float *)((long)data + lVar2 + 0xc0);
    fVar3 = *(float *)((long)data + lVar2 + 0x100);
    fVar10 = fVar3 * 0.097545706 + fVar13 * 0.27778545 + fVar7 * 0.49039266 + fVar8 * 0.41573495;
    fVar12 = fVar3 * -0.27778545 + fVar13 * -0.49039266 + fVar7 * 0.41573495 + fVar8 * -0.097545706;
    fVar5 = fVar3 * 0.41573495 + fVar13 * 0.097545706 + fVar7 * 0.27778545 + fVar8 * -0.49039266;
    fVar4 = *(float *)((long)data + lVar2 + 0x20);
    fVar11 = fVar3 * -0.49039266 + fVar13 * 0.41573495 + fVar7 * 0.097545706 + fVar8 * -0.27778545;
    fVar7 = *(float *)((long)data + lVar2 + 0xa0);
    fVar13 = (fVar4 + fVar7) * 0.35355362;
    fVar7 = (fVar4 - fVar7) * 0.35355362;
    fVar8 = fVar6 + fVar7;
    fVar7 = fVar7 - fVar6;
    fVar3 = fVar9 + fVar13;
    fVar13 = fVar13 - fVar9;
    *(float *)((long)data + lVar2 + 0x20) = fVar10 + fVar3;
    *(float *)((long)data + lVar2 + 0x40) = fVar12 + fVar8;
    *(float *)((long)data + lVar2 + 0x60) = fVar5 + fVar7;
    *(float *)((long)data + lVar2 + 0x80) = fVar11 + fVar13;
    *(float *)((long)data + lVar2 + 0xa0) = fVar13 - fVar11;
    *(float *)((long)data + lVar2 + 0xc0) = fVar7 - fVar5;
    *(float *)((long)data + lVar2 + 0xe0) = fVar8 - fVar12;
    *(float *)((long)data + lVar2 + 0x100) = fVar3 - fVar10;
  }
  return;
}

Assistant:

void
dctInverse8x8_scalar (float *data)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f*3.14159f / 16.0f);
    const float e = .5f * cosf (5.f*3.14159f / 16.0f);
    const float f = .5f * cosf (3.f*3.14159f / 8.0f);
    const float g = .5f * cosf (7.f*3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float *rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2]; 
        alpha[1] = f * rowPtr[2]; 
        alpha[2] = c * rowPtr[6]; 
        alpha[3] = f * rowPtr[6]; 

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 


        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];


        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16+column]; 
        alpha[1] = f * data[16+column]; 
        alpha[2] = c * data[48+column]; 
        alpha[3] = f * data[48+column]; 

        beta[0] = b * data[8+column]  + d * data[24+column] +
                  e * data[40+column] + g * data[56+column];

        beta[1] = d * data[8+column]  - g * data[24+column] -
                  b * data[40+column] - e * data[56+column];

        beta[2] = e * data[8+column]  - b * data[24+column] + 
                  g * data[40+column] + d * data[56+column];

        beta[3] = g * data[8+column]  - e * data[24+column] + 
                  d * data[40+column] - b * data[56+column];

        theta[0] = a * (data[column] + data[32+column]);
        theta[3] = a * (data[column] - data[32+column]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[     column] = gamma[0] + beta[0];
        data[ 8 + column] = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}